

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bencode.hpp
# Opt level: O0

int libtorrent::aux::
    write_integer<std::back_insert_iterator<std::__cxx11::string>,unsigned_long,void>
              (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *out,unsigned_long data)

{
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this;
  size_type sVar1;
  value_type local_61;
  const_iterator pvStack_60;
  char c;
  const_iterator __end2;
  const_iterator __begin2;
  string_view *__range2;
  string_view str;
  array<char,_21UL> buf;
  integer_type val;
  unsigned_long data_local;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *out_local;
  
  ___range2 = integer_to_str((array<char,_21UL> *)((long)&str._M_str + 3),data);
  __begin2 = (const_iterator)&__range2;
  __end2 = ::std::basic_string_view<char,_std::char_traits<char>_>::begin
                     ((basic_string_view<char,_std::char_traits<char>_> *)__begin2);
  pvStack_60 = ::std::basic_string_view<char,_std::char_traits<char>_>::end
                         ((basic_string_view<char,_std::char_traits<char>_> *)__begin2);
  for (; __end2 != pvStack_60; __end2 = __end2 + 1) {
    local_61 = *__end2;
    this = ::std::
           back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::operator*(out);
    ::std::
    back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator=(this,&local_61);
    ::std::
    back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(out);
  }
  sVar1 = ::std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)&__range2);
  return (int)sVar1;
}

Assistant:

int write_integer(OutIt& out, In data)
	{
		entry::integer_type const val = entry::integer_type(data);
		TORRENT_ASSERT(data == In(val));
		// the stack allocated buffer for keeping the
		// decimal representation of the number can
		// not hold number bigger than this:
		static_assert(sizeof(entry::integer_type) <= 8, "64 bit integers required");
		static_assert(sizeof(data) <= sizeof(entry::integer_type), "input data too big, see entry::integer_type");
		std::array<char, 21> buf;
		auto const str = integer_to_str(buf, val);
		for (char const c : str)
		{
			*out = c;
			++out;
		}
		return static_cast<int>(str.size());
	}